

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O1

void __thiscall QStatusBar::removeWidget(QStatusBar *this,QWidget *widget)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  ItemCategory IVar5;
  iterator aend;
  iterator iVar6;
  SBItem *pSVar7;
  SBItem *pSVar8;
  long *plVar9;
  long *plVar10;
  long *plVar11;
  long lVar12;
  const_iterator abegin;
  QList<QStatusBarPrivate::SBItem> *this_00;
  
  if (widget == (QWidget *)0x0) {
    return;
  }
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  plVar2 = *(long **)(lVar1 + 0x260);
  lVar3 = *(long *)(lVar1 + 0x268);
  plVar11 = plVar2;
  if (0 < lVar3 >> 2) {
    plVar11 = (long *)((lVar3 * 0x10 & 0xffffffffffffffc0U) + (long)plVar2);
    lVar12 = (lVar3 >> 2) + 1;
    plVar10 = plVar2 + 4;
    do {
      if ((QWidget *)plVar10[-4] == widget) {
        plVar10 = plVar10 + -4;
        goto LAB_0048fc94;
      }
      if ((QWidget *)plVar10[-2] == widget) {
        plVar10 = plVar10 + -2;
        goto LAB_0048fc94;
      }
      if ((QWidget *)*plVar10 == widget) goto LAB_0048fc94;
      if ((QWidget *)plVar10[2] == widget) {
        plVar10 = plVar10 + 2;
        goto LAB_0048fc94;
      }
      lVar12 = lVar12 + -1;
      plVar10 = plVar10 + 8;
    } while (1 < lVar12);
  }
  plVar9 = plVar2 + lVar3 * 2;
  lVar12 = (long)plVar9 - (long)plVar11 >> 4;
  if (lVar12 != 1) {
    if (lVar12 != 2) {
      plVar10 = plVar9;
      if ((lVar12 != 3) || (plVar10 = plVar11, (QWidget *)*plVar11 == widget)) goto LAB_0048fc94;
      plVar11 = plVar11 + 2;
    }
    plVar10 = plVar11;
    if ((QWidget *)*plVar11 == widget) goto LAB_0048fc94;
    plVar11 = plVar11 + 2;
  }
  plVar10 = plVar9;
  if ((QWidget *)*plVar11 == widget) {
    plVar10 = plVar11;
  }
LAB_0048fc94:
  lVar12 = (long)plVar10 - (long)plVar2;
  if (lVar12 >> 4 != lVar3) {
    this_00 = (QList<QStatusBarPrivate::SBItem> *)(lVar1 + 600);
    aend = QList<QStatusBarPrivate::SBItem>::end(this_00);
    iVar6 = QList<QStatusBarPrivate::SBItem>::begin(this_00);
    abegin.i = iVar6.i + lVar12;
    pSVar7 = iVar6.i + lVar12;
    while (pSVar8 = pSVar7, pSVar7 = pSVar8 + 1, pSVar7 != aend.i) {
      if (pSVar7->widget != widget) {
        iVar4 = pSVar8[1].stretch;
        IVar5 = pSVar8[1].category;
        (abegin.i)->widget = pSVar7->widget;
        (abegin.i)->stretch = iVar4;
        (abegin.i)->category = IVar5;
        abegin.i = abegin.i + 1;
      }
    }
    QList<QStatusBarPrivate::SBItem>::erase(this_00,abegin,(const_iterator)aend.i);
    if (aend.i != abegin.i) {
      QWidget::hide(widget);
      reformat(this);
      return;
    }
  }
  return;
}

Assistant:

void QStatusBar::removeWidget(QWidget *widget)
{
    if (!widget)
        return;

    Q_D(QStatusBar);
    if (d->items.removeIf([widget](const auto &item) { return item.widget == widget; })) {
        widget->hide();
        reformat();
    }
#if defined(QT_DEBUG)
    else
        qDebug("QStatusBar::removeWidget(): Widget not found.");
#endif
}